

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_itrans_recon.c
# Opt level: O3

void ihevc_itrans_recon_4x4_ttype1
               (WORD16 *pi2_src,WORD16 *pi2_tmp,UWORD8 *pu1_pred,UWORD8 *pu1_dst,WORD32 src_strd,
               WORD32 pred_strd,WORD32 dst_strd,WORD32 zero_cols,WORD32 zero_rows)

{
  WORD16 *pWVar1;
  short sVar2;
  UWORD8 *pUVar3;
  byte *pbVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  
  lVar9 = 0;
  do {
    if ((zero_cols & 1U) == 0) {
      iVar6 = (int)pi2_src[src_strd * 3 + lVar9] + (int)pi2_src[src_strd * 2 + lVar9];
      iVar8 = (int)pi2_src[src_strd * 2 + lVar9] + (int)pi2_src[lVar9];
      sVar2 = pi2_src[src_strd + lVar9];
      iVar7 = sVar2 * 0x4a;
      iVar5 = iVar7 + iVar8 * 0x1d + 0x40 + iVar6 * 0x37 >> 7;
      if (iVar5 < -0x7fff) {
        iVar5 = -0x8000;
      }
      if (0x7ffe < iVar5) {
        iVar5 = 0x7fff;
      }
      iVar10 = (int)pi2_src[lVar9] - (int)pi2_src[src_strd * 3 + lVar9];
      pi2_tmp[lVar9 * 4] = (WORD16)iVar5;
      iVar6 = iVar10 * 0x37 + iVar7 + 0x40 + iVar6 * -0x1d >> 7;
      if (iVar6 < -0x7fff) {
        iVar6 = -0x8000;
      }
      if (0x7ffe < iVar6) {
        iVar6 = 0x7fff;
      }
      pi2_tmp[lVar9 * 4 + 1] = (WORD16)iVar6;
      iVar6 = ((int)pi2_src[src_strd * 3 + lVar9] +
              ((int)pi2_src[lVar9] - (int)pi2_src[src_strd * 2 + lVar9])) * 0x4a + 0x40 >> 7;
      if (iVar6 < -0x7fff) {
        iVar6 = -0x8000;
      }
      if (0x7ffe < iVar6) {
        iVar6 = 0x7fff;
      }
      pi2_tmp[lVar9 * 4 + 2] = (WORD16)iVar6;
      iVar6 = iVar10 * 0x1d + iVar8 * 0x37 + sVar2 * -0x4a + 0x40 >> 7;
      if (iVar6 < -0x7fff) {
        iVar6 = -0x8000;
      }
      if (0x7ffe < iVar6) {
        iVar6 = 0x7fff;
      }
      pi2_tmp[lVar9 * 4 + 3] = (WORD16)iVar6;
    }
    else {
      pWVar1 = pi2_tmp + lVar9 * 4;
      pWVar1[0] = 0;
      pWVar1[1] = 0;
      pWVar1[2] = 0;
      pWVar1[3] = 0;
    }
    zero_cols = zero_cols >> 1;
    lVar9 = lVar9 + 1;
  } while ((int)lVar9 != 4);
  pbVar4 = pu1_pred + 3;
  pUVar3 = pu1_dst + 3;
  lVar9 = 0;
  do {
    iVar6 = (int)pi2_tmp[lVar9 + 0xc] + (int)pi2_tmp[lVar9 + 8];
    iVar5 = (int)pi2_tmp[lVar9 + 8] + (int)pi2_tmp[lVar9];
    sVar2 = pi2_tmp[lVar9 + 4];
    iVar7 = sVar2 * 0x4a;
    iVar8 = (uint)pbVar4[-3] + (iVar7 + iVar5 * 0x1d + 0x800 + iVar6 * 0x37 >> 0xc);
    if (iVar8 < 1) {
      iVar8 = 0;
    }
    if (0xfe < iVar8) {
      iVar8 = 0xff;
    }
    iVar10 = (int)pi2_tmp[lVar9] - (int)pi2_tmp[lVar9 + 0xc];
    pUVar3[-3] = (UWORD8)iVar8;
    iVar6 = (uint)pbVar4[-2] + (iVar10 * 0x37 + iVar7 + 0x800 + iVar6 * -0x1d >> 0xc);
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    if (0xfe < iVar6) {
      iVar6 = 0xff;
    }
    pUVar3[-2] = (UWORD8)iVar6;
    iVar6 = (uint)pbVar4[-1] +
            (((int)pi2_tmp[lVar9 + 0xc] + ((int)pi2_tmp[lVar9] - (int)pi2_tmp[lVar9 + 8])) * 0x4a +
             0x800 >> 0xc);
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    if (0xfe < iVar6) {
      iVar6 = 0xff;
    }
    pUVar3[-1] = (UWORD8)iVar6;
    iVar6 = (uint)*pbVar4 + (iVar10 * 0x1d + iVar5 * 0x37 + sVar2 * -0x4a + 0x800 >> 0xc);
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    if (0xfe < iVar6) {
      iVar6 = 0xff;
    }
    *pUVar3 = (UWORD8)iVar6;
    lVar9 = lVar9 + 1;
    pbVar4 = pbVar4 + pred_strd;
    pUVar3 = pUVar3 + dst_strd;
  } while ((int)lVar9 != 4);
  return;
}

Assistant:

void ihevc_itrans_recon_4x4_ttype1(WORD16 *pi2_src,
                                   WORD16 *pi2_tmp,
                                   UWORD8 *pu1_pred,
                                   UWORD8 *pu1_dst,
                                   WORD32 src_strd,
                                   WORD32 pred_strd,
                                   WORD32 dst_strd,
                                   WORD32 zero_cols,
                                   WORD32 zero_rows)
{
    WORD32 i, c[4];
    WORD32 add;
    WORD32 shift;
    WORD16 *pi2_tmp_orig;
    WORD32 trans_size;
    UNUSED(zero_rows);
    trans_size = TRANS_SIZE_4;

    pi2_tmp_orig = pi2_tmp;

    /* Inverse Transform 1st stage */
    shift = IT_SHIFT_STAGE_1;
    add = 1 << (shift - 1);

    for(i = 0; i < trans_size; i++)
    {
        /* Checking for Zero Cols */
        if((zero_cols & 1) == 1)
        {
            memset(pi2_tmp, 0, trans_size * sizeof(WORD16));
        }
        else
        {
            // Intermediate Variables
            c[0] = pi2_src[0] + pi2_src[2 * src_strd];
            c[1] = pi2_src[2 * src_strd] + pi2_src[3 * src_strd];
            c[2] = pi2_src[0] - pi2_src[3 * src_strd];
            c[3] = 74 * pi2_src[src_strd];

            pi2_tmp[0] =
                            CLIP_S16((29 * c[0] + 55 * c[1] + c[3] + add) >> shift);
            pi2_tmp[1] =
                            CLIP_S16((55 * c[2] - 29 * c[1] + c[3] + add) >> shift);
            pi2_tmp[2] =
                            CLIP_S16((74 * (pi2_src[0] - pi2_src[2 * src_strd] + pi2_src[3 * src_strd]) + add) >> shift);
            pi2_tmp[3] =
                            CLIP_S16((55 * c[0] + 29 * c[2] - c[3] + add) >> shift);
        }
        pi2_src++;
        pi2_tmp += trans_size;
        zero_cols = zero_cols >> 1;
    }

    pi2_tmp = pi2_tmp_orig;

    /* Inverse Transform 2nd stage */
    shift = IT_SHIFT_STAGE_2;
    add = 1 << (shift - 1);

    for(i = 0; i < trans_size; i++)
    {
        WORD32 itrans_out;
        // Intermediate Variables
        c[0] = pi2_tmp[0] + pi2_tmp[2 * trans_size];
        c[1] = pi2_tmp[2 * trans_size] + pi2_tmp[3 * trans_size];
        c[2] = pi2_tmp[0] - pi2_tmp[3 * trans_size];
        c[3] = 74 * pi2_tmp[trans_size];

        itrans_out =
                        CLIP_S16((29 * c[0] + 55 * c[1] + c[3] + add) >> shift);
        pu1_dst[0] = CLIP_U8((itrans_out + pu1_pred[0]));
        itrans_out =
                        CLIP_S16((55 * c[2] - 29 * c[1] + c[3] + add) >> shift);
        pu1_dst[1] = CLIP_U8((itrans_out + pu1_pred[1]));
        itrans_out =
                        CLIP_S16((74 * (pi2_tmp[0] - pi2_tmp[2 * trans_size] + pi2_tmp[3 * trans_size]) + add) >> shift);
        pu1_dst[2] = CLIP_U8((itrans_out + pu1_pred[2]));
        itrans_out =
                        CLIP_S16((55 * c[0] + 29 * c[2] - c[3] + add) >> shift);
        pu1_dst[3] = CLIP_U8((itrans_out + pu1_pred[3]));
        pi2_tmp++;
        pu1_pred += pred_strd;
        pu1_dst += dst_strd;
    }
}